

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O3

void __thiscall
trento::Event::compute
          (Event *this,Nucleus *nucleusA,Nucleus *nucleusB,NucleonCommon *nucleon_common)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  size_type sVar4;
  pointer pNVar5;
  pointer pCVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  undefined1 auVar11 [16];
  int iVar12;
  pointer pCVar13;
  pointer pNVar14;
  int iVar15;
  Grid *TX;
  int iVar16;
  double *extraout_RDX;
  long lVar17;
  pointer pCVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  Event *pEVar23;
  double *pdVar24;
  long lVar25;
  long lVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined8 in_XMM14_Qa;
  undefined8 in_XMM14_Qb;
  undefined1 auVar35 [64];
  undefined1 auVar42 [64];
  
  this->npart_ = 0;
  compute_nuclear_thickness(this,nucleusA,nucleon_common,&this->TA_);
  TX = &this->TB_;
  pEVar23 = this;
  compute_nuclear_thickness(this,nucleusB,nucleon_common,TX);
  if ((this->compute_reduced_thickness_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->compute_reduced_thickness_)._M_invoker)((_Any_data *)this);
    compute_observables(this);
    return;
  }
  std::__throw_bad_function_call();
  sVar4 = (TX->super_multi_array_ref<double,_2UL>).
          super_const_multi_array_ref<double,_2UL,_double_*>.num_elements_;
  if (sVar4 != 0) {
    memset((TX->super_multi_array_ref<double,_2UL>).
           super_const_multi_array_ref<double,_2UL,_double_*>.base_ +
           (TX->super_multi_array_ref<double,_2UL>).
           super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_,0,sVar4 << 3);
  }
  pNVar5 = (nucleusB->nucleons_).
           super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar14 = (nucleusB->nucleons_).
                 super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                 _M_impl.super__Vector_impl_data._M_start; pNVar14 != pNVar5; pNVar14 = pNVar14 + 1)
  {
    if (pNVar14->is_participant_ == true) {
      pEVar23->npart_ = pEVar23->npart_ + 1;
      pCVar13 = (pNVar14->constituents_).
                super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar6 = (pNVar14->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      dVar45 = pCVar13->x;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar45;
      auVar42 = ZEXT1664(auVar41);
      dVar32 = pCVar13->y;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar32;
      auVar35 = ZEXT1664(auVar33);
      pCVar13 = pCVar13 + 1;
      dVar36 = dVar32;
      dVar40 = dVar45;
      if (pCVar13 != pCVar6) {
        auVar43 = ZEXT1664(auVar41);
        auVar38 = ZEXT1664(auVar33);
        do {
          dVar45 = pCVar13->x;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = dVar45;
          if (auVar42._0_8_ <= dVar45) {
            if (auVar43._0_8_ < dVar45) {
              auVar43 = ZEXT1664(auVar28);
            }
          }
          else {
            auVar42 = ZEXT1664(auVar28);
          }
          dVar40 = auVar42._0_8_;
          dVar45 = auVar43._0_8_;
          dVar32 = pCVar13->y;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = dVar32;
          if (auVar35._0_8_ <= dVar32) {
            if (auVar38._0_8_ < dVar32) {
              auVar38 = ZEXT1664(auVar29);
            }
          }
          else {
            auVar35 = ZEXT1664(auVar29);
          }
          dVar36 = auVar38._0_8_;
          dVar32 = auVar35._0_8_;
          pCVar13 = pCVar13 + 1;
        } while (pCVar13 != pCVar6);
      }
      dVar27 = extraout_RDX[0xc];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar27;
      if (dVar27 < 0.0) {
        dVar27 = sqrt(dVar27);
      }
      else {
        auVar33 = vsqrtsd_avx(auVar30,auVar30);
        dVar27 = auVar33._0_8_;
      }
      dVar1 = pEVar23->xymax_;
      dVar2 = pEVar23->dxy_;
      iVar12 = pEVar23->nsteps_ + -1;
      iVar15 = (int)(((dVar32 - dVar27) + dVar1) / dVar2);
      iVar22 = iVar15;
      if (iVar12 < iVar15) {
        iVar22 = iVar12;
      }
      if (iVar15 < 0) {
        iVar22 = 0;
      }
      iVar16 = (int)((dVar36 + dVar27 + dVar1) / dVar2);
      iVar15 = iVar16;
      if (iVar12 < iVar16) {
        iVar15 = iVar12;
      }
      if (iVar16 < 0) {
        iVar15 = 0;
      }
      if (iVar22 <= iVar15) {
        lVar7 = (TX->super_multi_array_ref<double,_2UL>).
                super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[0];
        lVar8 = (TX->super_multi_array_ref<double,_2UL>).
                super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[1];
        iVar19 = (int)((dVar45 + dVar27 + dVar1) / dVar2);
        iVar16 = iVar19;
        if (iVar12 < iVar19) {
          iVar16 = iVar12;
        }
        iVar20 = (int)(((dVar40 - dVar27) + dVar1) / dVar2);
        if (iVar19 < 0) {
          iVar16 = 0;
        }
        if (iVar20 <= iVar12) {
          iVar12 = iVar20;
        }
        lVar9 = (TX->super_multi_array_ref<double,_2UL>).
                super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_;
        if (iVar20 < 0) {
          iVar12 = 0;
        }
        pdVar10 = (TX->super_multi_array_ref<double,_2UL>).
                  super_const_multi_array_ref<double,_2UL,_double_*>.base_;
        lVar26 = (long)iVar22;
        do {
          if (iVar12 <= iVar16) {
            pCVar13 = (pNVar14->constituents_).
                      super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar21 = lVar7 * lVar26;
            pCVar6 = (pNVar14->constituents_).
                     super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            lVar25 = (long)iVar12;
            do {
              if (pCVar13 == pCVar6) {
                dVar45 = 0.0;
              }
              else {
                auVar37._8_8_ = 0;
                auVar37._0_8_ = pEVar23->dxy_;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = pEVar23->xymax_;
                auVar44._8_8_ = 0;
                auVar44._0_8_ = extraout_RDX[2];
                auVar35 = ZEXT1664(ZEXT816(0));
                auVar34._8_8_ = 0;
                auVar34._0_8_ = (double)(int)lVar25 + 0.5;
                auVar33 = vfmsub213sd_fma(auVar34,auVar37,auVar39);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = (double)(int)lVar26 + 0.5;
                auVar41 = vfmsub213sd_fma(auVar37,auVar31,auVar39);
                pdVar24 = &pCVar13->fluctuation;
                do {
                  dVar45 = auVar33._0_8_ - ((Constituent *)(pdVar24 + -2))->x;
                  dVar32 = auVar41._0_8_ - pdVar24[-1];
                  dVar45 = dVar45 * dVar45 + dVar32 * dVar32;
                  if (dVar45 < extraout_RDX[0xc]) {
                    dVar45 = (dVar45 * -0.5) / extraout_RDX[0xb];
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = (dVar45 - *extraout_RDX) / extraout_RDX[2] + 0.5;
                    lVar17 = vcvttsd2usi_avx512f(auVar48);
                    auVar11._8_8_ = in_XMM14_Qb;
                    auVar11._0_8_ = in_XMM14_Qa;
                    auVar28 = vcvtusi2sd_avx512f(auVar11,lVar17);
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = (dVar45 + 1.0) - *extraout_RDX;
                    auVar28 = vfnmadd213sd_fma(auVar28,auVar44,auVar46);
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = *pdVar24;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = auVar28._0_8_ * *(double *)((long)extraout_RDX[3] + lVar17 * 8);
                    auVar28 = vfmadd231sd_fma(auVar35._0_16_,auVar47,auVar3);
                    auVar35 = ZEXT1664(auVar28);
                  }
                  dVar45 = auVar35._0_8_;
                  pCVar18 = (pointer)(pdVar24 + 1);
                  pdVar24 = pdVar24 + 3;
                } while (pCVar18 != pCVar6);
              }
              lVar17 = lVar8 * lVar25;
              lVar25 = lVar25 + 1;
              pdVar10[lVar9 + lVar21 + lVar17] =
                   dVar45 * extraout_RDX[0xe] + pdVar10[lVar9 + lVar21 + lVar17];
            } while (iVar16 + 1 != (int)lVar25);
          }
          lVar26 = lVar26 + 1;
        } while (iVar15 + 1 != (int)lVar26);
      }
    }
  }
  return;
}

Assistant:

void Event::compute(const Nucleus& nucleusA, const Nucleus& nucleusB,
                    const NucleonCommon& nucleon_common) {
  // Reset npart; compute_nuclear_thickness() increments it.
  npart_ = 0;
  compute_nuclear_thickness(nucleusA, nucleon_common, TA_);
  compute_nuclear_thickness(nucleusB, nucleon_common, TB_);
  compute_reduced_thickness_();
  compute_observables();
}